

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec_utils.c
# Opt level: O2

_Bool apprun_shebang_requires_external_executable(char *shebang,char *appdir)

{
  _Bool _Var1;
  char *path;
  
  if (shebang == (char *)0x0) {
    _Var1 = false;
  }
  else {
    path = apprun_shebang_extract_interpreter_path(shebang);
    if ((path == (char *)0x0) || (*path != '/')) {
      _Var1 = false;
    }
    else {
      _Var1 = apprun_is_path_child_of(path,appdir);
      _Var1 = !_Var1;
    }
    free(path);
  }
  return _Var1;
}

Assistant:

bool apprun_shebang_requires_external_executable(const char* shebang, const char* appdir) {
    bool requires_external_interpreter = false;
    if (shebang != NULL) {
        char* interp_path = apprun_shebang_extract_interpreter_path(shebang);
        if (interp_path != NULL) {
            if (interp_path[0] == '/')
                requires_external_interpreter = !apprun_is_path_child_of(interp_path, appdir);

            // relative path will be treated as relative to the runtime dir on execution
        }

        free(interp_path);
    }

    return requires_external_interpreter;
}